

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makePipelineDef
          (StringTree *__return_storage_ptr__,CapnpcCppMain *this,StringPtr fullName,
          StringPtr unqualifiedParentType,TemplateContext *templateContext,bool isUnion,
          Array<kj::StringTree> *methodDecls)

{
  Array<kj::StringTree> *params_6;
  char (*in_stack_ffffffffffffff58) [192];
  StringTree local_78;
  undefined1 local_39;
  CapnpcCppMain *pCStack_38;
  bool isUnion_local;
  CapnpcCppMain *this_local;
  StringPtr unqualifiedParentType_local;
  StringPtr fullName_local;
  
  unqualifiedParentType_local.content.ptr = (char *)unqualifiedParentType.content.size_;
  this_local = (CapnpcCppMain *)unqualifiedParentType.content.ptr;
  unqualifiedParentType_local.content.size_ = (size_t)fullName.content.ptr;
  local_39 = isUnion;
  pCStack_38 = this;
  TemplateContext::allDecls(&local_78,templateContext);
  params_6 = kj::mv<kj::Array<kj::StringTree>>(methodDecls);
  kj::
  strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
            (__return_storage_ptr__,(kj *)0x417f88,(char (*) [17])&local_78,(StringTree *)0x418849,
             (char (*) [7])&unqualifiedParentType_local.content.size_,
             (StringPtr *)"::Pipeline {\npublic:\n  typedef ",(char (*) [32])&this_local,
             (StringPtr *)
             " Pipelines;\n\n  inline Pipeline(decltype(nullptr)): _typeless(nullptr) {}\n  inline explicit Pipeline(::capnp::AnyPointer::Pipeline&& typeless)\n      : _typeless(kj::mv(typeless)) {}\n\n"
             ,(char (*) [183])params_6,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::AnyPointer::Pipeline _typeless;\n  friend class ::capnp::PipelineHook;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n};\n#endif  // !CAPNP_LITE\n\n"
             ,in_stack_ffffffffffffff58);
  kj::StringTree::~StringTree(&local_78);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree makePipelineDef(kj::StringPtr fullName, kj::StringPtr unqualifiedParentType,
                                 const TemplateContext& templateContext, bool isUnion,
                                 kj::Array<kj::StringTree>&& methodDecls) {
    return kj::strTree(
        "#if !CAPNP_LITE\n",
        templateContext.allDecls(),
        "class ", fullName, "::Pipeline {\n"
        "public:\n"
        "  typedef ", unqualifiedParentType, " Pipelines;\n"
        "\n"
        "  inline Pipeline(decltype(nullptr)): _typeless(nullptr) {}\n"
        "  inline explicit Pipeline(::capnp::AnyPointer::Pipeline&& typeless)\n"
        "      : _typeless(kj::mv(typeless)) {}\n"
        "\n",
        kj::mv(methodDecls),
        "private:\n"
        "  ::capnp::AnyPointer::Pipeline _typeless;\n"
        "  friend class ::capnp::PipelineHook;\n"
        "  template <typename, ::capnp::Kind>\n"
        "  friend struct ::capnp::ToDynamic_;\n"
        "};\n"
        "#endif  // !CAPNP_LITE\n"
        "\n");
  }